

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O1

int run_test_loop_handles(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  long lVar3;
  uv_timer_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  void *local_18;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_prepare_init(puVar2,&prepare_1_handle);
  local_18 = (void *)(long)iVar1;
  if (local_18 == (void *)0x0) {
    iVar1 = uv_prepare_start(&prepare_1_handle,(uv_prepare_cb)0x0);
    if (iVar1 != -0x16) goto LAB_001a87f1;
    iVar1 = uv_prepare_start(&prepare_1_handle,prepare_1_cb);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001a87f6;
    puVar2 = uv_default_loop();
    iVar1 = uv_check_init(puVar2,&check_handle);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001a8805;
    iVar1 = uv_check_start(&check_handle,check_cb);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001a8814;
    puVar2 = uv_default_loop();
    iVar1 = uv_prepare_init(puVar2,&prepare_2_handle);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001a8823;
    lVar3 = 0;
    do {
      local_18 = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_idle_init(puVar2,(uv_idle_t *)((long)&idle_1_handles[0].data + lVar3));
      local_18 = (void *)(long)iVar1;
      if (local_18 != (void *)0x0) {
        run_test_loop_handles_cold_7();
        goto LAB_001a87e2;
      }
      lVar3 = lVar3 + 0x58;
    } while (lVar3 != 0x268);
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001a8832;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,100,100);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001a8841;
    uv_unref((uv_handle_t *)&timer_handle);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_18 = (void *)(long)iVar1;
    if (local_18 != (void *)0x0) goto LAB_001a8850;
    local_18 = (void *)(long)loop_iteration;
    if (local_18 != (void *)0x15) goto LAB_001a885f;
    local_18 = (void *)(long)prepare_1_cb_called;
    if (local_18 != (void *)0x15) goto LAB_001a886e;
    local_18 = (void *)0x1;
    if (prepare_1_close_cb_called != 1) goto LAB_001a887d;
    local_18 = (void *)(long)prepare_2_cb_called;
    if (local_18 != (void *)0xa) goto LAB_001a888c;
    local_18 = (void *)0x1;
    if (prepare_2_close_cb_called != 1) goto LAB_001a889b;
    local_18 = (void *)(long)check_cb_called;
    if (local_18 != (void *)0x15) goto LAB_001a88aa;
    local_18 = (void *)0x1;
    if (check_close_cb_called != 1) goto LAB_001a88b9;
    local_18 = (void *)(long)idle_1_close_cb_called;
    if (local_18 != (void *)0x7) goto LAB_001a88c8;
    local_18 = (void *)(long)idle_2_close_cb_called;
    if (local_18 != (void *)(long)idle_2_cb_started) goto LAB_001a88d7;
    local_18 = (void *)(ulong)idle_2_is_active;
    if (local_18 == (void *)0x0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      local_18 = (void *)0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (local_18 == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001a88f5;
    }
  }
  else {
LAB_001a87e2:
    run_test_loop_handles_cold_1();
LAB_001a87f1:
    run_test_loop_handles_cold_2();
LAB_001a87f6:
    run_test_loop_handles_cold_3();
LAB_001a8805:
    run_test_loop_handles_cold_4();
LAB_001a8814:
    run_test_loop_handles_cold_5();
LAB_001a8823:
    run_test_loop_handles_cold_6();
LAB_001a8832:
    run_test_loop_handles_cold_8();
LAB_001a8841:
    run_test_loop_handles_cold_9();
LAB_001a8850:
    run_test_loop_handles_cold_10();
LAB_001a885f:
    run_test_loop_handles_cold_11();
LAB_001a886e:
    run_test_loop_handles_cold_12();
LAB_001a887d:
    run_test_loop_handles_cold_13();
LAB_001a888c:
    run_test_loop_handles_cold_14();
LAB_001a889b:
    run_test_loop_handles_cold_15();
LAB_001a88aa:
    run_test_loop_handles_cold_16();
LAB_001a88b9:
    run_test_loop_handles_cold_17();
LAB_001a88c8:
    run_test_loop_handles_cold_18();
LAB_001a88d7:
    run_test_loop_handles_cold_19();
  }
  run_test_loop_handles_cold_20();
LAB_001a88f5:
  handle = (uv_timer_t *)&stack0xffffffffffffffe8;
  run_test_loop_handles_cold_21();
  if (handle == &timer_handle) {
    return 0x388518;
  }
  timer_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(loop_handles) {
  int i;
  int r;

  r = uv_prepare_init(uv_default_loop(), &prepare_1_handle);
  ASSERT_OK(r);
  r = uv_prepare_start(&prepare_1_handle, NULL);
  ASSERT(r == UV_EINVAL);
  r = uv_prepare_start(&prepare_1_handle, prepare_1_cb);
  ASSERT_OK(r);

  r = uv_check_init(uv_default_loop(), &check_handle);
  ASSERT_OK(r);
  r = uv_check_start(&check_handle, check_cb);
  ASSERT_OK(r);

  /* initialize only, prepare_2 is started by prepare_1_cb */
  r = uv_prepare_init(uv_default_loop(), &prepare_2_handle);
  ASSERT_OK(r);

  for (i = 0; i < IDLE_COUNT; i++) {
    /* initialize only, idle_1 handles are started by check_cb */
    r = uv_idle_init(uv_default_loop(), &idle_1_handles[i]);
    ASSERT_OK(r);
  }

  /* don't init or start idle_2, both is done by idle_1_cb */

  /* The timer callback is there to keep the event loop polling unref it as it
   * is not supposed to keep the loop alive */
  r = uv_timer_init(uv_default_loop(), &timer_handle);
  ASSERT_OK(r);
  r = uv_timer_start(&timer_handle, timer_cb, TIMEOUT, TIMEOUT);
  ASSERT_OK(r);
  uv_unref((uv_handle_t*)&timer_handle);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(loop_iteration, ITERATIONS);

  ASSERT_EQ(prepare_1_cb_called, ITERATIONS);
  ASSERT_EQ(1, prepare_1_close_cb_called);

  ASSERT_EQ(prepare_2_cb_called, ITERATIONS / 2);
  ASSERT_EQ(1, prepare_2_close_cb_called);

  ASSERT_EQ(check_cb_called, ITERATIONS);
  ASSERT_EQ(1, check_close_cb_called);

  /* idle_1_cb should be called a lot */
  ASSERT_EQ(idle_1_close_cb_called, IDLE_COUNT);

  ASSERT_EQ(idle_2_close_cb_called, idle_2_cb_started);
  ASSERT_OK(idle_2_is_active);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}